

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::DeformableConv2D_x86_fma::create_pipeline(DeformableConv2D_x86_fma *this,Option *opt)

{
  uint uVar1;
  void *__ptr;
  Allocator *pAVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  Mat *pMVar8;
  Layer *pLVar9;
  int *piVar10;
  int ic;
  int iVar11;
  ulong uVar12;
  undefined4 *puVar13;
  int i;
  ulong uVar14;
  int j;
  uint _h;
  ulong uVar15;
  _func_int ***ppp_Var16;
  int p;
  long lVar17;
  _func_int **pp_Var18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  _func_int **pp_Var23;
  undefined4 *puVar24;
  undefined4 *puVar25;
  int iVar26;
  ParamDict pd_5;
  ParamDict pd;
  undefined1 local_178 [8];
  int local_170;
  Allocator *local_168;
  int iStack_160;
  int iStack_15c;
  size_t sStack_158;
  int local_150 [2];
  size_t local_148;
  void *local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  size_t local_130;
  int local_128;
  Allocator *local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  size_t sStack_110;
  int local_108;
  size_t local_100;
  undefined4 *local_f0;
  undefined4 *local_e8;
  ModelBinFromMatArray local_e0;
  uint local_cc;
  Mat local_c8;
  ulong local_80;
  ulong local_78;
  Mat *local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  undefined4 *local_40;
  void *local_38;
  
  switch((this->super_DeformableConv2D).activation_type) {
  case 1:
    pLVar9 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  case 2:
    pLVar9 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_DeformableConv2D).activation_params.data);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  case 3:
    pLVar9 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_DeformableConv2D).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4)
                  );
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  case 4:
    pLVar9 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  case 5:
    pLVar9 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  case 6:
    pLVar9 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_DeformableConv2D).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_DeformableConv2D).activation_params.data + 4)
                  );
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    break;
  default:
    pLVar9 = (Layer *)0x0;
    goto LAB_0050adcd;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar9->_vptr_Layer[4])(pLVar9,opt);
LAB_0050adcd:
  this->activation = pLVar9;
  iVar26 = (this->super_DeformableConv2D).kernel_w;
  local_78 = (ulong)iVar26;
  iVar11 = (this->super_DeformableConv2D).kernel_h;
  local_80 = (ulong)iVar11;
  _h = iVar11 * iVar26;
  uVar1 = (this->super_DeformableConv2D).num_output;
  uVar15 = (long)(this->super_DeformableConv2D).weight_data_size / (long)(int)_h;
  uVar15 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
  uVar14 = (long)uVar15 / (long)(int)uVar1;
  if (opt->use_packing_layout == true) {
    uVar21 = (uint)((uVar14 & 3) == 0) * 3 + 1;
    if ((uVar14 & 7) == 0) {
      uVar21 = 8;
    }
    uVar22 = (uint)((uVar1 & 3) == 0) * 3 + 1;
    if ((uVar1 & 7) == 0) {
      uVar22 = 8;
    }
  }
  else {
    uVar21 = 1;
    uVar22 = uVar21;
  }
  iVar26 = (int)uVar14;
  if (opt->use_sgemm_convolution == true) {
    pLVar9 = create_layer_cpu(0x4a);
    this->gemm = pLVar9;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,2,0);
    ParamDict::set(&pd_5,3,0);
    ParamDict::set(&pd_5,4,1);
    ParamDict::set(&pd_5,5,0);
    ParamDict::set(&pd_5,6,1);
    ParamDict::set(&pd_5,7,(this->super_DeformableConv2D).num_output);
    ParamDict::set(&pd_5,8,0);
    ParamDict::set(&pd_5,9,iVar26 * _h);
    ParamDict::set(&pd_5,10,-(uint)((this->super_DeformableConv2D).bias_term == 0) | 1);
    ParamDict::set(&pd_5,0xb,1);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_5);
    local_c8.cstep = 0;
    local_c8.data = (Allocator *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)local_c8.data;
    local_c8.dims = (int)local_c8.refcount;
    local_c8.w = local_c8.refcount._4_4_;
    local_c8._48_8_ = local_c8.elemsize;
    local_c8.c = local_c8.elempack;
    Mat::reshape((Mat *)&pd,&(this->super_DeformableConv2D).weight_data,_h,iVar26,
                 (this->super_DeformableConv2D).num_output,(Allocator *)0x0);
    uVar14 = 0;
    Mat::create(&local_c8,iVar26 * _h,(this->super_DeformableConv2D).num_output,4,(Allocator *)0x0);
    uVar1 = (this->super_DeformableConv2D).num_output;
    uVar15 = (ulong)_h;
    if ((int)_h < 1) {
      uVar15 = uVar14;
    }
    uVar19 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar19 = uVar14;
    }
    for (; uVar14 != uVar19; uVar14 = uVar14 + 1) {
      ppp_Var16 = (_func_int ***)
                  ((long)(_func_int ***)local_c8.data +
                  (long)local_c8.w * local_c8.elemsize * uVar14);
      for (lVar17 = 0; lVar17 < (long)((long)iVar26 - (ulong)(uVar21 - 1));
          lVar17 = lVar17 + (ulong)uVar21) {
        pp_Var18 = (_func_int **)
                   ((iStack_15c * lVar17 + local_148 * uVar14) * (long)local_178 +
                   (long)pd._vptr_ParamDict);
        for (uVar20 = 0; pp_Var23 = pp_Var18, uVar12 = (ulong)uVar21, uVar20 != uVar15;
            uVar20 = uVar20 + 1) {
          while (uVar12 != 0) {
            *(undefined4 *)ppp_Var16 = *(undefined4 *)pp_Var23;
            ppp_Var16 = (_func_int ***)((long)ppp_Var16 + 4);
            pp_Var23 = (_func_int **)((long)pp_Var23 + (long)local_178 * (long)iStack_15c);
            uVar12 = uVar12 - 1;
          }
          pp_Var18 = (_func_int **)((long)pp_Var18 + 4);
        }
      }
    }
    piVar10 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_168 == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_168->_vptr_Allocator[3])();
        }
      }
    }
    if ((this->super_DeformableConv2D).bias_term == 0) {
      piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      pd._vptr_ParamDict = (_func_int **)local_c8.data;
      pd.d._0_4_ = (int)local_c8.refcount;
      pd.d._4_4_ = local_c8.refcount._4_4_;
      local_178 = (undefined1  [8])local_c8.elemsize;
      local_170 = local_c8.elempack;
      local_168 = local_c8.allocator;
      iStack_160 = local_c8.dims;
      iStack_15c = local_c8.w;
      sStack_158._0_4_ = local_c8.h;
      sStack_158._4_4_ = local_c8.d;
      local_150[0] = local_c8.c;
      local_148 = local_c8.cstep;
      pLVar9 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_e0,(Mat *)&pd);
      (*pLVar9->_vptr_Layer[3])(pLVar9,&local_e0);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_e0);
      piVar10 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_168 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_168->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_178 = SUB128(ZEXT812(0),4);
      piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      local_100 = 0;
      local_108 = 0;
      sStack_110 = (size_t)local_178;
      uStack_114 = 0;
      uStack_118 = 0;
      local_120 = (Allocator *)0x0;
      local_128 = 0;
      local_130 = (size_t)local_178;
      uStack_134 = 0;
      uStack_138 = 0;
      local_140 = (void *)0x0;
      if ((Mat *)&local_140 != &(this->super_DeformableConv2D).bias_data) {
        piVar10 = (this->super_DeformableConv2D).bias_data.refcount;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
        local_140 = (this->super_DeformableConv2D).bias_data.data;
        piVar10 = (this->super_DeformableConv2D).bias_data.refcount;
        uStack_138 = SUB84(piVar10,0);
        uStack_134 = (undefined4)((ulong)piVar10 >> 0x20);
        local_130 = (this->super_DeformableConv2D).bias_data.elemsize;
        local_128 = (this->super_DeformableConv2D).bias_data.elempack;
        local_120 = (this->super_DeformableConv2D).bias_data.allocator;
        uVar5 = (this->super_DeformableConv2D).bias_data.dims;
        uVar6 = (this->super_DeformableConv2D).bias_data.w;
        sStack_110._0_4_ = (this->super_DeformableConv2D).bias_data.h;
        sStack_110._4_4_ = (this->super_DeformableConv2D).bias_data.d;
        local_108 = (this->super_DeformableConv2D).bias_data.c;
        local_100 = (this->super_DeformableConv2D).bias_data.cstep;
        uStack_118 = uVar5;
        uStack_114 = uVar6;
      }
      local_148 = local_c8.cstep;
      local_150[0] = local_c8.c;
      sStack_158._0_4_ = local_c8.h;
      sStack_158._4_4_ = local_c8.d;
      iStack_15c = local_c8.w;
      iStack_160 = local_c8.dims;
      local_168 = local_c8.allocator;
      local_170 = local_c8.elempack;
      local_178 = (undefined1  [8])local_c8.elemsize;
      pd.d._4_4_ = local_c8.refcount._4_4_;
      pd.d._0_4_ = (int)local_c8.refcount;
      pd._vptr_ParamDict = (_func_int **)local_c8.data;
      pLVar9 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_e0,(Mat *)&pd);
      (*pLVar9->_vptr_Layer[3])(pLVar9,&local_e0);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_e0);
      lVar17 = 0x48;
      do {
        piVar10 = *(int **)((long)&pd.d + lVar17);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (*(long **)((long)&local_168 + lVar17) == (long *)0x0) {
              free(*(void **)((long)&pd._vptr_ParamDict + lVar17));
            }
            else {
              (**(code **)(**(long **)((long)&local_168 + lVar17) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_148 + lVar17) = 0;
        *(undefined8 *)((long)&pd.d + lVar17 + 4) = 0;
        *(undefined8 *)(local_178 + lVar17 + 4) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar17) = 0;
        *(undefined8 *)((long)&pd.d + lVar17) = 0;
        *(undefined4 *)((long)local_150 + lVar17) = 0;
        *(undefined8 *)((long)&iStack_160 + lVar17) = 0;
        *(undefined8 *)((long)local_150 + lVar17 + -8) = 0;
        lVar17 = lVar17 + -0x48;
      } while (lVar17 != -0x48);
    }
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    ParamDict::~ParamDict(&pd_5);
  }
  else if ((uVar22 == 1) && (uVar21 == 1)) {
    piVar10 = (this->super_DeformableConv2D).weight_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    piVar10 = (this->weight_data_tm).refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        __ptr = (this->weight_data_tm).data;
        pAVar2 = (this->weight_data_tm).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free(__ptr);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])(pAVar2,__ptr,(long)uVar15 % (long)(int)uVar1 & 0xffffffff);
        }
      }
    }
    piVar10 = (this->super_DeformableConv2D).weight_data.refcount;
    (this->weight_data_tm).data = (this->super_DeformableConv2D).weight_data.data;
    (this->weight_data_tm).refcount = piVar10;
    (this->weight_data_tm).elemsize = (this->super_DeformableConv2D).weight_data.elemsize;
    (this->weight_data_tm).elempack = (this->super_DeformableConv2D).weight_data.elempack;
    (this->weight_data_tm).allocator = (this->super_DeformableConv2D).weight_data.allocator;
    iVar26 = (this->super_DeformableConv2D).weight_data.w;
    iVar11 = (this->super_DeformableConv2D).weight_data.h;
    iVar7 = (this->super_DeformableConv2D).weight_data.d;
    (this->weight_data_tm).dims = (this->super_DeformableConv2D).weight_data.dims;
    (this->weight_data_tm).w = iVar26;
    (this->weight_data_tm).h = iVar11;
    (this->weight_data_tm).d = iVar7;
    (this->weight_data_tm).c = (this->super_DeformableConv2D).weight_data.c;
    (this->weight_data_tm).cstep = (this->super_DeformableConv2D).weight_data.cstep;
  }
  else {
    local_70 = &this->weight_data_tm;
    local_f0 = (undefined4 *)(this->super_DeformableConv2D).weight_data.data;
    iVar11 = uVar21 * uVar22;
    Mat::create(local_70,(int)(iVar26 * _h * uVar1) / iVar11,(ulong)(uint)(iVar11 * 4),iVar11,
                (Allocator *)0x0);
    pMVar8 = local_70;
    uVar19 = 0;
    local_38 = (this->weight_data_tm).data;
    uVar15 = uVar14 & 0xffffffff;
    if (iVar26 < 1) {
      uVar15 = uVar19;
    }
    local_48 = 0;
    if (0 < (int)local_78) {
      local_48 = local_78 & 0xffffffff;
    }
    local_50 = 0;
    if (0 < (int)local_80) {
      local_50 = local_80 & 0xffffffff;
    }
    local_68 = 0;
    if (0 < (int)uVar1) {
      local_68 = (ulong)uVar1;
    }
    local_60 = local_78 * 4;
    puVar25 = local_f0;
    for (; puVar13 = puVar25, uVar19 != local_68; uVar19 = uVar19 + 1) {
      local_e8 = puVar13;
      for (uVar14 = 0; uVar14 != local_50; uVar14 = uVar14 + 1) {
        puVar25 = local_e8;
        for (uVar20 = 0; puVar24 = puVar25, uVar20 != local_48; uVar20 = uVar20 + 1) {
          puVar25 = puVar24;
          for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            uVar3 = (ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff;
            uVar4 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
            *(undefined4 *)
             ((long)local_38 +
             (long)(int)((((((int)((long)uVar4 / (long)(int)uVar22) * (int)local_80 + (int)uVar14) *
                            (int)local_78 + (int)uVar20) * (iVar26 / (int)uVar21) +
                          (int)((long)uVar3 / (long)(int)uVar21)) * uVar21 +
                         (int)((long)uVar3 % (long)(int)uVar21)) * uVar22 +
                        (int)((long)uVar4 % (long)(int)uVar22)) * 4) = *puVar25;
            puVar25 = puVar25 + local_80 * local_78;
          }
          puVar25 = puVar24 + 1;
          local_40 = puVar24;
        }
        local_e8 = local_e8 + local_78;
      }
      puVar25 = puVar13 + (long)iVar26 * local_80 * local_78;
      local_f0 = puVar13;
    }
    local_cc = uVar1;
    local_58 = (ulong)_h;
    Mat::reshape((Mat *)&pd,local_70,iVar26 / (int)uVar21,_h,(int)uVar1 / (int)uVar22,
                 (Allocator *)0x0);
    piVar10 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
    if ((Mat *)&pd != pMVar8) {
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      piVar10 = (this->weight_data_tm).refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          pAVar2 = (this->weight_data_tm).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->weight_data_tm).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
      (this->weight_data_tm).data = pd._vptr_ParamDict;
      (this->weight_data_tm).refcount = (int *)CONCAT44(pd.d._4_4_,(int)pd.d);
      (this->weight_data_tm).elemsize = (size_t)local_178;
      (this->weight_data_tm).elempack = local_170;
      (this->weight_data_tm).allocator = local_168;
      (this->weight_data_tm).dims = iStack_160;
      (this->weight_data_tm).w = iStack_15c;
      (this->weight_data_tm).h = (undefined4)sStack_158;
      (this->weight_data_tm).d = sStack_158._4_4_;
      (this->weight_data_tm).c = local_150[0];
      (this->weight_data_tm).cstep = local_148;
    }
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_168 == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_168->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    piVar10 = (this->super_DeformableConv2D).weight_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pAVar2 = (this->super_DeformableConv2D).weight_data.allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->super_DeformableConv2D).weight_data.data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeformableConv2D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeformableConv2D).weight_data.elemsize + 4) = 0;
    (this->super_DeformableConv2D).weight_data.data = (void *)0x0;
    (this->super_DeformableConv2D).weight_data.refcount = (int *)0x0;
    (this->super_DeformableConv2D).weight_data.dims = 0;
    (this->super_DeformableConv2D).weight_data.w = 0;
    (this->super_DeformableConv2D).weight_data.h = 0;
    (this->super_DeformableConv2D).weight_data.d = 0;
    (this->super_DeformableConv2D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86_fma::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}